

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_push(DisasContext_conflict2 *s,TCGv_i32 val)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 val_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  pTVar1 = get_areg(s,7);
  tcg_gen_subi_i32_m68k(tcg_ctx_00,ret,pTVar1,4);
  gen_store(s,2,ret,val,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  pTVar1 = get_areg(s,7);
  tcg_gen_mov_i32(tcg_ctx_00,pTVar1,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_push(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, val, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, QREG_SP, tmp);
    tcg_temp_free(tcg_ctx, tmp);
}